

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elfio_dump.hpp
# Opt level: O2

string * __thiscall
ELFIO::dump::format_assoc<ELFIO::class_table_t[2],unsigned_char>
          (string *__return_storage_ptr__,dump *this,class_table_t (*table) [2],uchar *key)

{
  bool bVar1;
  ostream *poVar2;
  ostringstream oss;
  string asStack_1a8 [32];
  ostringstream local_188 [376];
  
  find_value_in_table<ELFIO::class_table_t[2],unsigned_char>(__return_storage_ptr__,this,table,key);
  bVar1 = std::operator==(__return_storage_ptr__,"?");
  if (bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_188);
    poVar2 = std::operator<<((ostream *)local_188,(string *)__return_storage_ptr__);
    poVar2 = std::operator<<(poVar2," (0x");
    *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
         *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xffffffb5 | 8;
    poVar2 = std::operator<<(poVar2,(*table)[0].key);
    std::operator<<(poVar2,")");
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,asStack_1a8);
    std::__cxx11::string::~string(asStack_1a8);
    std::__cxx11::ostringstream::~ostringstream(local_188);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string format_assoc( const T& table, const K& key )
    {
        std::string str = find_value_in_table( table, key );
        if ( str == "?" ) {
            std::ostringstream oss;
            oss << str << " (0x" << std::hex << key << ")";
            str = oss.str();
        }

        return str;
    }